

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

bool __thiscall despot::Pocman::SmellFood(Pocman *this,PocmanState *pocstate)

{
  bool bVar1;
  int iVar2;
  vector<bool,_std::allocator<bool>_> *this_00;
  const_reference local_41;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  Coord smellPos;
  PocmanState *pocstate_local;
  Pocman *this_local;
  
  _smellPos = pocstate;
  despot::Coord::Coord((Coord *)&local_28);
  local_28 = -this->smell_range_;
  do {
    if (this->smell_range_ < local_28) {
      return false;
    }
    for (local_24 = -this->smell_range_; local_24 <= this->smell_range_; local_24 = local_24 + 1) {
      local_30 = despot::operator+(&_smellPos->pocman_pos,(Coord *)&local_28);
      bVar1 = Grid<int>::Inside(&this->maze_,(Coord *)&local_30);
      local_41 = false;
      if (bVar1) {
        this_00 = &_smellPos->food;
        local_38 = despot::operator+(&_smellPos->pocman_pos,(Coord *)&local_28);
        iVar2 = Grid<int>::Index(&this->maze_,(Coord *)&local_38);
        local_41 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)iVar2);
      }
      if (local_41 != false) {
        return true;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool Pocman::SmellFood(const PocmanState& pocstate) const {
	Coord smellPos;
	for (smellPos.x = -smell_range_; smellPos.x <= smell_range_; smellPos.x++)
		for (smellPos.y = -smell_range_; smellPos.y <= smell_range_; smellPos.y++)
			if (maze_.Inside(pocstate.pocman_pos + smellPos)
				&& pocstate.food[maze_.Index(pocstate.pocman_pos + smellPos)])
				return true;
	return false;
}